

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineBlendTests.cpp
# Opt level: O2

float vkt::pipeline::anon_unknown_0::BlendTestInstance::getNormChannelThreshold
                (TextureFormat *format,int numBits)

{
  TextureChannelClass TVar1;
  byte bVar2;
  
  bVar2 = (byte)numBits;
  TVar1 = tcu::getTextureChannelClass(format->type);
  if (TVar1 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
    bVar2 = bVar2 - 1;
  }
  else if (TVar1 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    return 0.0;
  }
  return 4.0 / (float)~(-1 << (bVar2 & 0x1f));
}

Assistant:

float BlendTestInstance::getNormChannelThreshold (const tcu::TextureFormat& format, int numBits)
{
	switch (tcu::getTextureChannelClass(format.type))
	{
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:	return BlendTest::QUAD_COUNT / static_cast<float>((1 << numBits) - 1);
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:	return BlendTest::QUAD_COUNT / static_cast<float>((1 << (numBits - 1)) - 1);
		default:
			break;
	}

	DE_ASSERT(false);
	return 0.0f;
}